

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

uint ParseConfirmTarget(UniValue *value,uint max_target)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  uint in_ESI;
  uint *in_RDI;
  long in_FS_OFFSET;
  uint unsigned_target;
  int target;
  string *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  UniValue *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = UniValue::getInt<int>(in_stack_fffffffffffffff0);
  if (((int)uVar2 < 1) || (in_ESI < uVar2)) {
    uVar3 = __cxa_allocate_exception(0x58);
    tinyformat::format<int,unsigned_int>
              ((char *)in_stack_ffffffffffffffd8,(int *)CONCAT44(in_ESI,1),in_RDI);
    JSONRPCError(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int ParseConfirmTarget(const UniValue& value, unsigned int max_target)
{
    const int target{value.getInt<int>()};
    const unsigned int unsigned_target{static_cast<unsigned int>(target)};
    if (target < 1 || unsigned_target > max_target) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid conf_target, must be between %u and %u", 1, max_target));
    }
    return unsigned_target;
}